

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vktDrawCreateInfoUtil.cpp
# Opt level: O3

void __thiscall
vkt::Draw::ImageViewCreateInfo::ImageViewCreateInfo
          (ImageViewCreateInfo *this,VkImage _image,VkImageViewType _viewType,VkFormat _format,
          VkComponentMapping *_components,VkImageViewCreateFlags _flags)

{
  VkComponentSwizzle VVar1;
  VkComponentSwizzle VVar2;
  VkComponentSwizzle VVar3;
  TextureFormat TVar4;
  VkImageAspectFlags VVar5;
  
  (this->super_VkImageViewCreateInfo).sType = VK_STRUCTURE_TYPE_IMAGE_VIEW_CREATE_INFO;
  (this->super_VkImageViewCreateInfo).pNext = (void *)0x0;
  (this->super_VkImageViewCreateInfo).flags = 0;
  (this->super_VkImageViewCreateInfo).image.m_internal = _image.m_internal;
  (this->super_VkImageViewCreateInfo).viewType = _viewType;
  (this->super_VkImageViewCreateInfo).format = _format;
  VVar1 = _components->g;
  VVar2 = _components->b;
  VVar3 = _components->a;
  (this->super_VkImageViewCreateInfo).components.r = _components->r;
  (this->super_VkImageViewCreateInfo).components.g = VVar1;
  (this->super_VkImageViewCreateInfo).components.b = VVar2;
  (this->super_VkImageViewCreateInfo).components.a = VVar3;
  TVar4 = ::vk::mapVkFormat(_format);
  VVar5 = 1;
  if (TVar4.order - D < 3) {
    VVar5 = TVar4.order * 2 - 0x22;
  }
  (this->super_VkImageViewCreateInfo).subresourceRange.aspectMask = VVar5;
  (this->super_VkImageViewCreateInfo).subresourceRange.baseMipLevel = 0;
  (this->super_VkImageViewCreateInfo).subresourceRange.levelCount = 1;
  (this->super_VkImageViewCreateInfo).subresourceRange.baseArrayLayer = 0;
  (this->super_VkImageViewCreateInfo).subresourceRange.layerCount = 1;
  (this->super_VkImageViewCreateInfo).flags = _flags;
  return;
}

Assistant:

ImageViewCreateInfo::ImageViewCreateInfo (vk::VkImage					_image,
										  vk::VkImageViewType			_viewType,
										  vk::VkFormat					_format,
										  const vk::VkComponentMapping&	_components,
										  vk::VkImageViewCreateFlags	_flags)
{
	sType = vk::VK_STRUCTURE_TYPE_IMAGE_VIEW_CREATE_INFO;
	pNext = DE_NULL;
	flags			= 0u;
	image			= _image;
	viewType		= _viewType;
	format			= _format;
	components.r	= _components.r;
	components.g	= _components.g;
	components.b	= _components.b;
	components.a	= _components.a;

	vk::VkImageAspectFlags aspectFlags;
	const tcu::TextureFormat tcuFormat = vk::mapVkFormat(_format);

	switch (tcuFormat.order)
	{
		case tcu::TextureFormat::D:
			aspectFlags = vk::VK_IMAGE_ASPECT_DEPTH_BIT;
			break;
		case tcu::TextureFormat::S:
			aspectFlags = vk::VK_IMAGE_ASPECT_STENCIL_BIT;
			break;
		case tcu::TextureFormat::DS:
			aspectFlags = vk::VK_IMAGE_ASPECT_STENCIL_BIT | vk::VK_IMAGE_ASPECT_DEPTH_BIT;
			break;
		default:
			aspectFlags = vk::VK_IMAGE_ASPECT_COLOR_BIT;
			break;
	}

	subresourceRange = ImageSubresourceRange(aspectFlags);;
	flags = _flags;
}